

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QCss::StyleRule>::reserve(QList<QCss::StyleRule> *this,qsizetype asize)

{
  bool bVar1;
  Int IVar2;
  QArrayDataPointer<QCss::StyleRule> *this_00;
  qsizetype qVar3;
  StyleRule *e;
  StyleRule *b;
  Data *pDVar4;
  long in_RSI;
  QArrayDataPointer<QCss::StyleRule> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QCss::StyleRule> *in_stack_ffffffffffffff78;
  QFlagsStorage<QArrayData::ArrayOption> f;
  QArrayDataPointer<QCss::StyleRule> *in_stack_ffffffffffffff80;
  QArrayDataPointer<QCss::StyleRule> *in_stack_ffffffffffffff88;
  AllocationOption option;
  QGenericArrayOps<QCss::StyleRule> *in_stack_ffffffffffffff90;
  qsizetype local_40;
  QArrayDataPointer<QCss::StyleRule> local_38;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_18;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_14;
  longlong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QArrayDataPointer<QCss::StyleRule> *)capacity((QList<QCss::StyleRule> *)0xa411af);
  qVar3 = QArrayDataPointer<QCss::StyleRule>::freeSpaceAtBegin(in_stack_ffffffffffffff88);
  option = (AllocationOption)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (in_RSI <= (long)this_00 - qVar3) {
    QArrayDataPointer<QCss::StyleRule>::operator->(in_RDI);
    local_18.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QArrayDataPointer<QCss::StyleRule>::flags(in_stack_ffffffffffffff80);
    local_14.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QFlags<QArrayData::ArrayOption>::operator&
                   ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,
                    (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_14);
    if (IVar2 != 0) goto LAB_00a41352;
    QArrayDataPointer<QCss::StyleRule>::operator->(in_RDI);
    bVar1 = QArrayDataPointer<QCss::StyleRule>::isShared(in_stack_ffffffffffffff80);
    if (!bVar1) {
      QArrayDataPointer<QCss::StyleRule>::operator->(in_RDI);
      f.i = (Int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      QFlags<QArrayData::ArrayOption>::QFlags
                ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff80,f.i);
      QArrayDataPointer<QCss::StyleRule>::setFlag
                ((QArrayDataPointer<QCss::StyleRule> *)0xa41256,(ArrayOptions)f.i);
      goto LAB_00a41352;
    }
  }
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (StyleRule *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = size((QList<QCss::StyleRule> *)in_RDI);
  qMax<long_long>(&local_10,&local_40);
  QArrayDataPointer<QCss::StyleRule>::QArrayDataPointer
            (this_00,(qsizetype)in_RDI,(qsizetype)in_stack_ffffffffffffff90,option);
  e = (StyleRule *)QArrayDataPointer<QCss::StyleRule>::operator->(&local_38);
  QArrayDataPointer<QCss::StyleRule>::operator->(in_RDI);
  b = QArrayDataPointer<QCss::StyleRule>::begin((QArrayDataPointer<QCss::StyleRule> *)0xa412d6);
  QArrayDataPointer<QCss::StyleRule>::operator->(in_RDI);
  QArrayDataPointer<QCss::StyleRule>::end((QArrayDataPointer<QCss::StyleRule> *)e);
  QtPrivate::QGenericArrayOps<QCss::StyleRule>::copyAppend(in_stack_ffffffffffffff90,b,e);
  pDVar4 = QArrayDataPointer<QCss::StyleRule>::d_ptr(&local_38);
  if (pDVar4 != (Data *)0x0) {
    in_stack_ffffffffffffff78 =
         (QArrayDataPointer<QCss::StyleRule> *)
         QArrayDataPointer<QCss::StyleRule>::operator->(&local_38);
    QFlags<QArrayData::ArrayOption>::QFlags
              ((QFlags<QArrayData::ArrayOption> *)e,
               (ArrayOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    QArrayDataPointer<QCss::StyleRule>::setFlag
              ((QArrayDataPointer<QCss::StyleRule> *)0xa41339,
               (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)
               SUB84((ulong)in_stack_ffffffffffffff78 >> 0x20,0));
  }
  QArrayDataPointer<QCss::StyleRule>::swap
            ((QArrayDataPointer<QCss::StyleRule> *)e,in_stack_ffffffffffffff78);
  QArrayDataPointer<QCss::StyleRule>::~QArrayDataPointer((QArrayDataPointer<QCss::StyleRule> *)e);
LAB_00a41352:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}